

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-close.c
# Opt level: O0

int run_test_poll_close(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  int local_290c;
  undefined1 local_2908 [4];
  int i;
  uv_poll_t poll_handles [64];
  uv_os_sock_t sockets [64];
  
  for (local_290c = 0; local_290c < 0x40; local_290c = local_290c + 1) {
    iVar1 = socket(2,1,0);
    sockets[(long)local_290c + -2] = iVar1;
    uVar2 = uv_default_loop();
    uv_poll_init_socket(uVar2,local_2908 + (long)local_290c * 0xa0,sockets[(long)local_290c + -2]);
    uv_poll_start(local_2908 + (long)local_290c * 0xa0,3,0);
  }
  for (local_290c = 0; local_290c < 0x40; local_290c = local_290c + 1) {
    uv_close(local_2908 + (long)local_290c * 0xa0);
  }
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if (close_cb_called != 0x40) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-poll-close.c"
            ,0x45,"close_cb_called == NUM_SOCKETS");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-poll-close.c"
            ,0x47,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(poll_close) {
  uv_os_sock_t sockets[NUM_SOCKETS];
  uv_poll_t poll_handles[NUM_SOCKETS];
  int i;

#ifdef _WIN32
  {
    struct WSAData wsa_data;
    int r = WSAStartup(MAKEWORD(2, 2), &wsa_data);
    ASSERT(r == 0);
  }
#endif

  for (i = 0; i < NUM_SOCKETS; i++) {
    sockets[i] = socket(AF_INET, SOCK_STREAM, 0);
    uv_poll_init_socket(uv_default_loop(), &poll_handles[i], sockets[i]);
    uv_poll_start(&poll_handles[i], UV_READABLE | UV_WRITABLE, NULL);
  }

  for (i = 0; i < NUM_SOCKETS; i++) {
    uv_close((uv_handle_t*) &poll_handles[i], close_cb);
  }

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == NUM_SOCKETS);

  MAKE_VALGRIND_HAPPY();
  return 0;
}